

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

deUint32 vkt::BindingModel::anon_unknown_1::getInterfaceNumResources
                   (ShaderInputInterface shaderInterface)

{
  deUint32 dVar1;
  
  dVar1 = 0;
  if (shaderInterface < SHADER_INPUT_LAST) {
    dVar1 = *(deUint32 *)(&DAT_00960450 + (ulong)shaderInterface * 4);
  }
  return dVar1;
}

Assistant:

deUint32 getInterfaceNumResources (ShaderInputInterface shaderInterface)
{
	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:					return 1u;
		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:		return 2u;
		case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:	return 2u;
		case SHADER_INPUT_DESCRIPTOR_ARRAY:						return 2u;

		default:
			DE_FATAL("Impossible");
			return 0u;
	}
}